

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::update(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this,int p_col,
        number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        *p_work,int *p_idx,int num)

{
  pointer pnVar1;
  bool bVar2;
  uint uVar3;
  fpclass_type fVar4;
  undefined8 uVar5;
  int32_t iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int32_t *piVar10;
  byte bVar11;
  int *piVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  uint *puVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  pointer pnVar16;
  cpp_dec_float<200U,_int,_void> *pcVar17;
  uint *puVar18;
  int iVar19;
  int *piVar20;
  fpclass_type *pfVar21;
  byte bVar22;
  cpp_dec_float<200U,_int,_void> uu;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_238;
  uint *local_1b0;
  uint local_1a8 [28];
  cpp_dec_float<200U,_int,_void> local_138;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar22 = 0;
  local_1a8[0x18] = 0;
  local_1a8[0x19] = 0;
  local_1a8[0x1a] = 0;
  local_1a8[0x14] = 0;
  local_1a8[0x15] = 0;
  local_1a8[0x16] = 0;
  local_1a8[0x17] = 0;
  local_1a8[0x10] = 0;
  local_1a8[0x11] = 0;
  local_1a8[0x12] = 0;
  local_1a8[0x13] = 0;
  local_1a8[0xc] = 0;
  local_1a8[0xd] = 0;
  local_1a8[0xe] = 0;
  local_1a8[0xf] = 0;
  local_1a8[8] = 0;
  local_1a8[9] = 0;
  local_1a8[10] = 0;
  local_1a8[0xb] = 0;
  local_1a8[4] = 0;
  local_1a8[5] = 0;
  local_1a8[6] = 0;
  local_1a8[7] = 0;
  local_1a8[0] = 0;
  local_1a8[1] = 0;
  local_1a8[2] = 0;
  local_1a8[3] = 0;
  local_138.fpclass = cpp_dec_float_finite;
  local_138.prec_elem = 0x1c;
  local_138.data._M_elems[0] = 0;
  local_138.data._M_elems[1] = 0;
  local_138.data._M_elems[2] = 0;
  local_138.data._M_elems[3] = 0;
  local_138.data._M_elems[4] = 0;
  local_138.data._M_elems[5] = 0;
  local_138.data._M_elems[6] = 0;
  local_138.data._M_elems[7] = 0;
  local_138.data._M_elems[8] = 0;
  local_138.data._M_elems[9] = 0;
  local_138.data._M_elems[10] = 0;
  local_138.data._M_elems[0xb] = 0;
  local_138.data._M_elems[0xc] = 0;
  local_138.data._M_elems[0xd] = 0;
  local_138.data._M_elems[0xe] = 0;
  local_138.data._M_elems[0xf] = 0;
  local_138.data._M_elems[0x10] = 0;
  local_138.data._M_elems[0x11] = 0;
  local_138.data._M_elems[0x12] = 0;
  local_138.data._M_elems[0x13] = 0;
  local_138.data._M_elems[0x14] = 0;
  local_138.data._M_elems[0x15] = 0;
  local_138.data._M_elems[0x16] = 0;
  local_138.data._M_elems[0x17] = 0;
  local_138.data._M_elems[0x18] = 0;
  local_138.data._M_elems[0x19] = 0;
  local_138.data._M_elems._104_5_ = 0;
  local_138.data._M_elems[0x1b]._1_3_ = 0;
  local_138.exp = 0;
  local_138.neg = false;
  local_b8.fpclass = cpp_dec_float_finite;
  local_b8.prec_elem = 0x1c;
  local_b8.data._M_elems[0] = 0;
  local_b8.data._M_elems[1] = 0;
  local_b8.data._M_elems[2] = 0;
  local_b8.data._M_elems[3] = 0;
  local_b8.data._M_elems[4] = 0;
  local_b8.data._M_elems[5] = 0;
  local_b8.data._M_elems[6] = 0;
  local_b8.data._M_elems[7] = 0;
  local_b8.data._M_elems[8] = 0;
  local_b8.data._M_elems[9] = 0;
  local_b8.data._M_elems[10] = 0;
  local_b8.data._M_elems[0xb] = 0;
  local_b8.data._M_elems[0xc] = 0;
  local_b8.data._M_elems[0xd] = 0;
  local_b8.data._M_elems[0xe] = 0;
  local_b8.data._M_elems[0xf] = 0;
  local_b8.data._M_elems[0x10] = 0;
  local_b8.data._M_elems[0x11] = 0;
  local_b8.data._M_elems[0x12] = 0;
  local_b8.data._M_elems[0x13] = 0;
  local_b8.data._M_elems[0x14] = 0;
  local_b8.data._M_elems[0x15] = 0;
  local_b8.data._M_elems[0x16] = 0;
  local_b8.data._M_elems[0x17] = 0;
  local_b8.data._M_elems[0x18] = 0;
  local_b8.data._M_elems[0x19] = 0;
  local_b8.data._M_elems._104_5_ = 0;
  local_b8.data._M_elems[0x1b]._1_3_ = 0;
  local_b8.exp = 0;
  local_b8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&local_238,1,(type *)0x0);
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&local_b8,&local_238,&p_work[p_col].m_backend);
  pcVar13 = &local_b8;
  pcVar15 = &local_138;
  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pcVar15->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar22 * -8 + 4);
    pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar22 * -8 + 4);
  }
  local_138.exp = local_b8.exp;
  local_138.neg = local_b8.neg;
  local_138.fpclass = local_b8.fpclass;
  local_138.prec_elem = local_b8.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&p_work[p_col].m_backend,0.0);
  iVar7 = makeLvec(this,num,p_col);
  pnVar1 = (this->l).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar20 = (this->l).idx;
  iVar19 = p_idx[(long)num + -1];
  if (iVar19 != p_col) {
    piVar12 = piVar20 + iVar7;
    pfVar21 = &pnVar1[iVar7].m_backend.fpclass;
    lVar8 = 0;
    do {
      *piVar12 = iVar19;
      pcVar15 = &p_work[iVar19].m_backend;
      local_238.fpclass = cpp_dec_float_finite;
      local_238.prec_elem = 0x1c;
      local_238.data._M_elems[0] = 0;
      local_238.data._M_elems[1] = 0;
      local_238.data._M_elems[2] = 0;
      local_238.data._M_elems[3] = 0;
      local_238.data._M_elems[4] = 0;
      local_238.data._M_elems[5] = 0;
      local_238.data._M_elems[6] = 0;
      local_238.data._M_elems[7] = 0;
      local_238.data._M_elems[8] = 0;
      local_238.data._M_elems[9] = 0;
      local_238.data._M_elems[10] = 0;
      local_238.data._M_elems[0xb] = 0;
      local_238.data._M_elems[0xc] = 0;
      local_238.data._M_elems[0xd] = 0;
      local_238.data._M_elems[0xe] = 0;
      local_238.data._M_elems[0xf] = 0;
      local_238.data._M_elems[0x10] = 0;
      local_238.data._M_elems[0x11] = 0;
      local_238.data._M_elems[0x12] = 0;
      local_238.data._M_elems[0x13] = 0;
      local_238.data._M_elems[0x14] = 0;
      local_238.data._M_elems[0x15] = 0;
      local_238.data._M_elems[0x16] = 0;
      local_238.data._M_elems[0x17] = 0;
      local_238.data._M_elems[0x18] = 0;
      local_238.data._M_elems[0x19] = 0;
      local_238.data._M_elems._104_5_ = 0;
      local_238.data._M_elems[0x1b]._1_3_ = 0;
      local_238.exp = 0;
      local_238.neg = false;
      pcVar13 = &local_138;
      if (&local_238 != pcVar15) {
        pcVar17 = &local_238;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pcVar17->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar22 * -8 + 4);
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
        }
        local_238.exp = local_138.exp;
        local_238.neg = local_138.neg;
        local_238.fpclass = local_138.fpclass;
        local_238.prec_elem = local_138.prec_elem;
        pcVar13 = pcVar15;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&local_238,pcVar13);
      pcVar13 = &local_238;
      pcVar17 = (cpp_dec_float<200U,_int,_void> *)(pfVar21 + -0x1e);
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pcVar17->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar22 * -8 + 4);
        pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + ((ulong)bVar22 * -2 + 1) * 4);
      }
      pfVar21[-2] = local_238.exp;
      *(bool *)(pfVar21 + -1) = local_238.neg;
      *(undefined8 *)pfVar21 = local_238._120_8_;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)pcVar15,0.0);
      iVar19 = p_idx[(long)(num + -1) + lVar8 + -1];
      piVar12 = piVar12 + 1;
      pfVar21 = pfVar21 + 0x20;
      lVar8 = lVar8 + -1;
    } while (iVar19 != p_col);
    iVar7 = iVar7 - (int)lVar8;
    num = num + (int)lVar8;
  }
  lVar9 = (long)iVar7;
  piVar20[lVar9] = p_col;
  local_b8.fpclass = cpp_dec_float_finite;
  local_b8.prec_elem = 0x1c;
  local_b8.data._M_elems[0] = 0;
  local_b8.data._M_elems[1] = 0;
  local_b8.data._M_elems[2] = 0;
  local_b8.data._M_elems[3] = 0;
  local_b8.data._M_elems[4] = 0;
  local_b8.data._M_elems[5] = 0;
  local_b8.data._M_elems[6] = 0;
  local_b8.data._M_elems[7] = 0;
  local_b8.data._M_elems[8] = 0;
  local_b8.data._M_elems[9] = 0;
  local_b8.data._M_elems[10] = 0;
  local_b8.data._M_elems[0xb] = 0;
  local_b8.data._M_elems[0xc] = 0;
  local_b8.data._M_elems[0xd] = 0;
  local_b8.data._M_elems[0xe] = 0;
  local_b8.data._M_elems[0xf] = 0;
  local_b8.data._M_elems[0x10] = 0;
  local_b8.data._M_elems[0x11] = 0;
  local_b8.data._M_elems[0x12] = 0;
  local_b8.data._M_elems[0x13] = 0;
  local_b8.data._M_elems[0x14] = 0;
  local_b8.data._M_elems[0x15] = 0;
  local_b8.data._M_elems[0x16] = 0;
  local_b8.data._M_elems[0x17] = 0;
  local_b8.data._M_elems[0x18] = 0;
  local_b8.data._M_elems[0x19] = 0;
  local_b8.data._M_elems._104_5_ = 0;
  local_b8.data._M_elems[0x1b]._1_3_ = 0;
  local_b8.exp = 0;
  local_b8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
            (&local_238,1,(type *)0x0);
  pcVar13 = &local_138;
  pcVar15 = &local_b8;
  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pcVar15->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar22 * -8 + 4);
    pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar22 * -8 + 4);
  }
  local_b8.exp = local_138.exp;
  local_b8.neg = local_138.neg;
  local_b8.fpclass = local_138.fpclass;
  local_b8.prec_elem = local_138.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=(&local_b8,&local_238);
  if (local_b8.data._M_elems[0] != 0 || local_b8.fpclass != cpp_dec_float_finite) {
    local_b8.neg = (bool)(local_b8.neg ^ 1);
  }
  pcVar13 = &local_b8;
  pnVar16 = pnVar1 + lVar9;
  for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
    (pnVar16->m_backend).data._M_elems[0] = (pcVar13->data)._M_elems[0];
    pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar22 * -8 + 4);
    pnVar16 = (pointer)((long)pnVar16 + ((ulong)bVar22 * -2 + 1) * 4);
  }
  pnVar1[lVar9].m_backend.exp = local_b8.exp;
  pnVar1[lVar9].m_backend.neg = local_b8.neg;
  pnVar1[lVar9].m_backend.fpclass = local_b8.fpclass;
  pnVar1[lVar9].m_backend.prec_elem = local_b8.prec_elem;
  if (1 < num) {
    local_1b0 = (this->maxabs).m_backend.data._M_elems + 1;
    piVar20 = piVar20 + lVar9;
    piVar10 = &pnVar1[lVar9 + 1].m_backend.prec_elem;
    lVar8 = (ulong)(num - 2) + 1;
    do {
      piVar20 = piVar20 + 1;
      iVar19 = p_idx[lVar8 + -1];
      *piVar20 = iVar19;
      pcVar15 = &p_work[iVar19].m_backend;
      local_238.fpclass = cpp_dec_float_finite;
      local_238.prec_elem = 0x1c;
      local_238.data._M_elems[0] = 0;
      local_238.data._M_elems[1] = 0;
      local_238.data._M_elems[2] = 0;
      local_238.data._M_elems[3] = 0;
      local_238.data._M_elems[4] = 0;
      local_238.data._M_elems[5] = 0;
      local_238.data._M_elems[6] = 0;
      local_238.data._M_elems[7] = 0;
      local_238.data._M_elems[8] = 0;
      local_238.data._M_elems[9] = 0;
      local_238.data._M_elems[10] = 0;
      local_238.data._M_elems[0xb] = 0;
      local_238.data._M_elems[0xc] = 0;
      local_238.data._M_elems[0xd] = 0;
      local_238.data._M_elems[0xe] = 0;
      local_238.data._M_elems[0xf] = 0;
      local_238.data._M_elems[0x10] = 0;
      local_238.data._M_elems[0x11] = 0;
      local_238.data._M_elems[0x12] = 0;
      local_238.data._M_elems[0x13] = 0;
      local_238.data._M_elems[0x14] = 0;
      local_238.data._M_elems[0x15] = 0;
      local_238.data._M_elems[0x16] = 0;
      local_238.data._M_elems[0x17] = 0;
      local_238.data._M_elems[0x18] = 0;
      local_238.data._M_elems[0x19] = 0;
      local_238.data._M_elems._104_5_ = 0;
      local_238.data._M_elems[0x1b]._1_3_ = 0;
      local_238.exp = 0;
      local_238.neg = false;
      pcVar13 = &local_138;
      if (&local_238 != pcVar15) {
        pcVar17 = &local_238;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pcVar17->data)._M_elems[0] = (pcVar13->data)._M_elems[0];
          pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + (ulong)bVar22 * -8 + 4);
          pcVar17 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar17 + (ulong)bVar22 * -8 + 4);
        }
        local_238.exp = local_138.exp;
        local_238.neg = local_138.neg;
        local_238.fpclass = local_138.fpclass;
        local_238.prec_elem = local_138.prec_elem;
        pcVar13 = pcVar15;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&local_238,pcVar13);
      uVar5 = local_238._120_8_;
      bVar2 = local_238.neg;
      iVar19 = local_238.exp;
      uVar3 = local_238.data._M_elems[0];
      puVar14 = local_238.data._M_elems + 1;
      puVar18 = local_1a8;
      for (lVar9 = 0x1b; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar18 = *puVar14;
        puVar14 = puVar14 + (ulong)bVar22 * -2 + 1;
        puVar18 = puVar18 + (ulong)bVar22 * -2 + 1;
      }
      fVar4 = local_238.fpclass;
      iVar6 = local_238.prec_elem;
      (((cpp_dec_float<200U,_int,_void> *)(piVar10 + -0x1f))->data)._M_elems[0] =
           local_238.data._M_elems[0];
      puVar14 = local_1a8;
      puVar18 = (uint *)(piVar10 + -0x1e);
      for (lVar9 = 0x1b; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar18 = *puVar14;
        puVar14 = puVar14 + (ulong)bVar22 * -2 + 1;
        puVar18 = puVar18 + (ulong)bVar22 * -2 + 1;
      }
      piVar10[-3] = local_238.exp;
      *(bool *)(piVar10 + -2) = local_238.neg;
      piVar10[-1] = local_238.fpclass;
      *piVar10 = local_238.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)pcVar15,0.0);
      puVar14 = local_1a8;
      puVar18 = local_238.data._M_elems + 1;
      for (lVar9 = 0x1b; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar18 = *puVar14;
        puVar14 = puVar14 + (ulong)bVar22 * -2 + 1;
        puVar18 = puVar18 + (ulong)bVar22 * -2 + 1;
      }
      local_238.data._M_elems._0_8_ = CONCAT44(local_238.data._M_elems[1],uVar3);
      local_238.neg = bVar2;
      if ((bVar2 == true) && (fVar4 != cpp_dec_float_finite || uVar3 != 0)) {
        local_238.neg = false;
      }
      if (((fVar4 != cpp_dec_float_NaN) && ((this->maxabs).m_backend.fpclass != cpp_dec_float_NaN))
         && (local_238.exp = iVar19, local_238._120_8_ = uVar5,
            iVar7 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_238,&(this->maxabs).m_backend), 0 < iVar7)) {
        if (bVar2 == false) {
          bVar11 = false;
        }
        else {
          bVar11 = bVar2 ^ (fVar4 != cpp_dec_float_finite || uVar3 != 0);
        }
        (this->maxabs).m_backend.data._M_elems[0] = uVar3;
        puVar14 = local_1a8;
        puVar18 = local_1b0;
        for (lVar9 = 0x1b; lVar9 != 0; lVar9 = lVar9 + -1) {
          *puVar18 = *puVar14;
          puVar14 = puVar14 + (ulong)bVar22 * -2 + 1;
          puVar18 = puVar18 + (ulong)bVar22 * -2 + 1;
        }
        (this->maxabs).m_backend.exp = iVar19;
        (this->maxabs).m_backend.neg = (bool)bVar11;
        (this->maxabs).m_backend.fpclass = fVar4;
        (this->maxabs).m_backend.prec_elem = iVar6;
      }
      piVar10 = piVar10 + 0x20;
      lVar9 = lVar8 + -1;
      bVar2 = 0 < lVar8;
      lVar8 = lVar9;
    } while (lVar9 != 0 && bVar2);
  }
  this->stat = OK;
  return;
}

Assistant:

void CLUFactor<R>::update(int p_col, R* p_work, const int* p_idx, int num)
{
   int ll, i, j;
   int* lidx;
   R* lval;
   R x, rezi;

   assert(p_work[p_col] != 0.0);
   rezi = 1 / p_work[p_col];
   p_work[p_col] = 0.0;

   ll = makeLvec(num, p_col);
   //   ll = fac->makeLvec(num, col);
   lval = l.val.data();
   lidx = l.idx;

   for(i = num - 1; (j = p_idx[i]) != p_col; --i)
   {
      lidx[ll] = j;
      lval[ll] = rezi * p_work[j];
      p_work[j] = 0.0;
      ++ll;
   }

   lidx[ll] = p_col;

   lval[ll] = 1 - rezi;
   ++ll;

   for(--i; i >= 0; --i)
   {
      j = p_idx[i];
      lidx[ll] = j;
      lval[ll] = x = rezi * p_work[j];
      p_work[j] = 0.0;
      ++ll;

      if(spxAbs(x) > maxabs)
         maxabs = spxAbs(x);
   }

   this->stat = SLinSolver<R>::OK;
}